

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_LoadFactor_Test<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_LoadFactor_Test<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  size_type sVar2;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  int i_1;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  float shrink_threshold;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  int i;
  size_t bucket_count;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  TypeParam ht;
  float grow_threshold;
  size_type kSize;
  float in_stack_fffffffffffffba8;
  float in_stack_fffffffffffffbac;
  HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffbb0;
  double *in_stack_fffffffffffffbb8;
  HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffbc0;
  key_equal *in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbd0;
  float in_stack_fffffffffffffbd4;
  float in_stack_fffffffffffffbd8;
  float in_stack_fffffffffffffbdc;
  float in_stack_fffffffffffffbe0;
  float in_stack_fffffffffffffbe4;
  float fVar3;
  float in_stack_fffffffffffffc28;
  float in_stack_fffffffffffffc2c;
  float in_stack_fffffffffffffc30;
  float in_stack_fffffffffffffc34;
  float local_3bc;
  float local_384;
  float local_37c;
  AssertionResult local_2e0 [2];
  key_equal *local_2c0;
  AssertionResult local_2b8 [3];
  value_type local_280;
  key_type local_278;
  key_type local_270;
  int local_264;
  float local_24c;
  AssertionResult local_248 [2];
  float local_224;
  undefined8 local_220;
  AssertionResult local_218;
  float local_204;
  size_type local_1f0;
  AssertionResult local_1e8 [2];
  size_type local_1c8;
  AssertionResult local_1c0 [3];
  value_type local_188;
  int local_17c;
  key_type local_178;
  value_type local_148;
  size_type local_140;
  float local_124;
  undefined8 local_120;
  AssertionResult local_118 [2];
  float local_f4;
  AssertionResult local_f0;
  key_type local_e0;
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> local_c8;
  Hasher local_b8;
  Hasher local_ac [12];
  float local_14;
  undefined8 local_10;
  
  local_10 = 0x4098;
  for (local_14 = 0.2; local_14 <= 0.8; local_14 = local_14 + 0.2) {
    Hasher::Hasher(local_ac,0);
    Hasher::Hasher(&local_b8,0);
    Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::Alloc(&local_c8,0,(int *)0x0);
    google::
    HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_DenseHashSet
              ((HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
               CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
               (hasher *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
               in_stack_fffffffffffffbc8,(allocator_type *)in_stack_fffffffffffffbc0);
    Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_c8);
    local_e0 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_fffffffffffffbc0,(int)((ulong)in_stack_fffffffffffffbb8 >> 0x20)
                          );
    google::
    BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_deleted_key((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffffbb0,
                      (key_type *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    google::
    BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::max_load_factor((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac);
    google::
    BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::min_load_factor((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac);
    local_f4 = google::
               BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::max_load_factor((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                                  *)0xcc9798);
    testing::internal::EqHelper::Compare<float,_float,_nullptr>
              ((char *)in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0,
               (float *)in_stack_fffffffffffffbb8,(float *)in_stack_fffffffffffffbb0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f0);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
      testing::AssertionResult::failure_message((AssertionResult *)0xcc9855);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                 (Type)in_stack_fffffffffffffbdc,
                 (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                 (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),(char *)in_stack_fffffffffffffbc0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                 (Message *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbb0);
      testing::Message::~Message((Message *)0xcc98b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcc9929);
    local_120 = 0;
    local_124 = google::
                BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                ::min_load_factor((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                                   *)0xcc9942);
    testing::internal::EqHelper::Compare<double,_float,_nullptr>
              ((char *)in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0,
               in_stack_fffffffffffffbb8,(float *)in_stack_fffffffffffffbb0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_118);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
      testing::AssertionResult::failure_message((AssertionResult *)0xcc99d2);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                 (Type)in_stack_fffffffffffffbdc,
                 (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                 (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),(char *)in_stack_fffffffffffffbc0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                 (Message *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbb0);
      testing::Message::~Message((Message *)0xcc9a35);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcc9aa6);
    google::
    BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::resize((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              *)in_stack_fffffffffffffbb0,
             CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    local_140 = google::
                BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                ::bucket_count((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                                *)0xcc9ac7);
    local_148 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffffbb0,(int)in_stack_fffffffffffffbac);
    google::
    BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
             (value_type *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
    local_178 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffffbc0,
                            (int)((ulong)in_stack_fffffffffffffbb8 >> 0x20));
    google::
    BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             *)in_stack_fffffffffffffbb0,
            (key_type *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    local_17c = 2;
    while( true ) {
      local_188 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                  ::UniqueObject(in_stack_fffffffffffffbb0,(int)in_stack_fffffffffffffbac);
      google::
      BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
               (value_type *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
      sVar2 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xcc9bd4);
      local_37c = (float)sVar2;
      local_384 = (float)local_140;
      if (local_14 <= local_37c / local_384) break;
      local_1c8 = google::
                  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                  ::bucket_count((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                                  *)0xcc9cbf);
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((char *)in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0,
                 (unsigned_long *)in_stack_fffffffffffffbb8,
                 (unsigned_long *)in_stack_fffffffffffffbb0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1c0);
      if (!bVar1) {
        testing::Message::Message
                  ((Message *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
        testing::AssertionResult::failure_message((AssertionResult *)0xcc9d4c);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                   (Type)in_stack_fffffffffffffbdc,
                   (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                   (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),(char *)in_stack_fffffffffffffbc0
                  );
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                   (Message *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbb0);
        testing::Message::~Message((Message *)0xcc9daf);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xcc9e1a);
      local_17c = local_17c + 1;
    }
    local_1f0 = google::
                BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                ::bucket_count((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                                *)0xcc9e3e);
    testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
              ((char *)in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0,
               (unsigned_long *)in_stack_fffffffffffffbb8,(unsigned_long *)in_stack_fffffffffffffbb0
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1e8);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
      testing::AssertionResult::failure_message((AssertionResult *)0xcc9eb9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                 (Type)in_stack_fffffffffffffbdc,
                 (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                 (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),(char *)in_stack_fffffffffffffbc0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                 (Message *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbb0);
      testing::Message::~Message((Message *)0xcc9f1c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcc9f87);
    sVar2 = google::
            BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            ::size((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                    *)0xcc9fc0);
    local_3bc = (float)sVar2;
    sVar2 = google::
            BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            ::bucket_count((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                            *)0xcca036);
    in_stack_fffffffffffffc2c = (float)(long)sVar2;
    in_stack_fffffffffffffc30 = (float)sVar2;
    local_204 = local_3bc / in_stack_fffffffffffffc30 + -0.01;
    google::
    BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_resizing_parameters
              ((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,in_stack_fffffffffffffba8);
    local_220 = 0x3ff0000000000000;
    in_stack_fffffffffffffc28 =
         google::
         BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
         ::max_load_factor((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                            *)0xcca0f7);
    local_224 = in_stack_fffffffffffffc28;
    testing::internal::EqHelper::Compare<double,_float,_nullptr>
              ((char *)in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0,
               in_stack_fffffffffffffbb8,(float *)in_stack_fffffffffffffbb0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_218);
    in_stack_fffffffffffffc34 = local_3bc;
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
      testing::AssertionResult::failure_message((AssertionResult *)0xcca175);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                 (Type)in_stack_fffffffffffffbdc,
                 (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                 (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),(char *)in_stack_fffffffffffffbc0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(local_3bc,in_stack_fffffffffffffc30),
                 (Message *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbb0);
      testing::Message::~Message((Message *)0xcca1d2);
      in_stack_fffffffffffffc34 = local_3bc;
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcca240);
    local_24c = google::
                BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                ::min_load_factor((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                                   *)0xcca24d);
    testing::internal::EqHelper::Compare<float,_float,_nullptr>
              ((char *)in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0,
               (float *)in_stack_fffffffffffffbb8,(float *)in_stack_fffffffffffffbb0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_248);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
      testing::AssertionResult::failure_message((AssertionResult *)0xcca2d7);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                 (Type)in_stack_fffffffffffffbdc,
                 (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                 (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),(char *)in_stack_fffffffffffffbc0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                 (Message *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbb0);
      testing::Message::~Message((Message *)0xcca334);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcca3a5);
    local_140 = google::
                BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                ::bucket_count((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                                *)0xcca3b2);
    local_264 = 2;
    while( true ) {
      local_270 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                  ::UniqueKey(in_stack_fffffffffffffbc0,
                              (int)((ulong)in_stack_fffffffffffffbb8 >> 0x20));
      google::
      BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
      ::erase((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               *)in_stack_fffffffffffffbb0,
              (key_type *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      local_278 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                  ::UniqueKey(in_stack_fffffffffffffbc0,
                              (int)((ulong)in_stack_fffffffffffffbb8 >> 0x20));
      google::
      BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
      ::erase((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               *)in_stack_fffffffffffffbb0,
              (key_type *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      local_280 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                  ::UniqueObject(in_stack_fffffffffffffbb0,(int)in_stack_fffffffffffffbac);
      google::
      BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
               (value_type *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
      sVar2 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xcca4a7);
      in_stack_fffffffffffffbe0 = (float)(long)sVar2;
      in_stack_fffffffffffffbd4 = (float)sVar2;
      in_stack_fffffffffffffbd8 = (float)(long)local_140;
      in_stack_fffffffffffffbdc = (float)local_140;
      if (in_stack_fffffffffffffbd4 / in_stack_fffffffffffffbdc <= local_204) break;
      fVar3 = in_stack_fffffffffffffbd4;
      in_stack_fffffffffffffbc8 =
           (key_equal *)
           google::
           BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           ::bucket_count((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                           *)0xcca564);
      local_2c0 = in_stack_fffffffffffffbc8;
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((char *)in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0,
                 (unsigned_long *)in_stack_fffffffffffffbb8,
                 (unsigned_long *)in_stack_fffffffffffffbb0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2b8);
      if (!bVar1) {
        testing::Message::Message((Message *)CONCAT44(fVar3,in_stack_fffffffffffffbe0));
        in_stack_fffffffffffffbc0 =
             (HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              *)testing::AssertionResult::failure_message((AssertionResult *)0xcca5eb);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT44(fVar3,in_stack_fffffffffffffbe0),
                   (Type)in_stack_fffffffffffffbdc,
                   (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                   (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),(char *)in_stack_fffffffffffffbc0
                  );
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                   (Message *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbb0);
        testing::Message::~Message((Message *)0xcca648);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xcca6b3);
      local_264 = local_264 + 1;
    }
    in_stack_fffffffffffffbe4 = in_stack_fffffffffffffbd4;
    in_stack_fffffffffffffbb8 =
         (double *)
         google::
         BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
         ::bucket_count((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                         *)0xcca6d7);
    testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
              ((char *)in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0,
               (unsigned_long *)in_stack_fffffffffffffbb8,(unsigned_long *)in_stack_fffffffffffffbb0
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2e0);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
      in_stack_fffffffffffffbb0 =
           (HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            *)testing::AssertionResult::failure_message((AssertionResult *)0xcca74c);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                 (Type)in_stack_fffffffffffffbdc,
                 (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                 (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),(char *)in_stack_fffffffffffffbc0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                 (Message *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbb0);
      testing::Message::~Message((Message *)0xcca7a9);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcca814);
    google::
    HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_DenseHashSet
              ((HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                *)0xcca84a);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, LoadFactor) {
  const typename TypeParam::size_type kSize = 16536;
  // Check growing past various thresholds and then shrinking below
  // them.
  for (float grow_threshold = 0.2f; grow_threshold <= 0.8f;
       grow_threshold += 0.2f) {
    TypeParam ht;
    ht.set_deleted_key(this->UniqueKey(1));
    ht.max_load_factor(grow_threshold);
    ht.min_load_factor(0.0);
    EXPECT_EQ(grow_threshold, ht.max_load_factor());
    EXPECT_EQ(0.0, ht.min_load_factor());

    ht.resize(kSize);
    size_t bucket_count = ht.bucket_count();
    // Erase and insert an element to set consider_shrink = true,
    // which should not cause a shrink because the threshold is 0.0.
    ht.insert(this->UniqueObject(2));
    ht.erase(this->UniqueKey(2));
    for (int i = 2;; ++i) {
      ht.insert(this->UniqueObject(i));
      if (static_cast<float>(ht.size()) / bucket_count < grow_threshold) {
        EXPECT_EQ(bucket_count, ht.bucket_count());
      } else {
        EXPECT_GT(ht.bucket_count(), bucket_count);
        break;
      }
    }
    // Now set a shrink threshold 1% below the current size and remove
    // items until the size falls below that.
    const float shrink_threshold =
        static_cast<float>(ht.size()) / ht.bucket_count() - 0.01f;

    // This time around, check the old set_resizing_parameters interface.
    ht.set_resizing_parameters(shrink_threshold, 1.0);
    EXPECT_EQ(1.0, ht.max_load_factor());
    EXPECT_EQ(shrink_threshold, ht.min_load_factor());

    bucket_count = ht.bucket_count();
    for (int i = 2;; ++i) {
      ht.erase(this->UniqueKey(i));
      // A resize is only triggered by an insert, so add and remove a
      // value every iteration to trigger the shrink as soon as the
      // threshold is passed.
      ht.erase(this->UniqueKey(i + 1));
      ht.insert(this->UniqueObject(i + 1));
      if (static_cast<float>(ht.size()) / bucket_count > shrink_threshold) {
        EXPECT_EQ(bucket_count, ht.bucket_count());
      } else {
        EXPECT_LT(ht.bucket_count(), bucket_count);
        break;
      }
    }
  }
}